

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O0

void __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraKateGenerator>::
cmExternalMakefileProjectGeneratorSimpleFactory
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraKateGenerator> *this,string *n,
          string *doc)

{
  string local_60;
  string local_40;
  string *local_20;
  string *doc_local;
  string *n_local;
  cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraKateGenerator> *this_local;
  
  local_20 = doc;
  doc_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)n);
  std::__cxx11::string::string((string *)&local_60,(string *)local_20);
  cmExternalMakefileProjectGeneratorFactory::cmExternalMakefileProjectGeneratorFactory
            (&this->super_cmExternalMakefileProjectGeneratorFactory,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_cmExternalMakefileProjectGeneratorFactory).
  _vptr_cmExternalMakefileProjectGeneratorFactory =
       (_func_int **)&PTR__cmExternalMakefileProjectGeneratorSimpleFactory_00fef4d8;
  return;
}

Assistant:

cmExternalMakefileProjectGeneratorSimpleFactory(const std::string& n,
                                                  const std::string& doc)
    : cmExternalMakefileProjectGeneratorFactory(n, doc)
  {
  }